

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O3

bool __thiscall
MasterObjectHolder::removeFed(MasterObjectHolder *this,string_view fedName,int validationCode)

{
  __uniq_ptr_impl<helics::FedObject,_std::default_delete<helics::FedObject>_> *p_Var1;
  FedObject *pFVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar4;
  __uniq_ptr_impl<helics::FedObject,_std::default_delete<helics::FedObject>_> *p_Var5;
  size_t __n;
  unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_> *fed;
  __uniq_ptr_impl<helics::FedObject,_std::default_delete<helics::FedObject>_> *this_01;
  _Map_pointer ppuVar6;
  size_type __rlen;
  handle handle;
  bool local_60;
  unique_lock<std::mutex> local_40;
  
  __n = fedName._M_len;
  local_40._M_device = &(this->feds).m_mutex;
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  this_01 = (__uniq_ptr_impl<helics::FedObject,_std::default_delete<helics::FedObject>_> *)
            (this->feds).m_obj.
            super__Deque_base<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  p_Var1 = (__uniq_ptr_impl<helics::FedObject,_std::default_delete<helics::FedObject>_> *)
           (this->feds).m_obj.
           super__Deque_base<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (this_01 == p_Var1) {
    local_60 = false;
  }
  else {
    p_Var5 = (__uniq_ptr_impl<helics::FedObject,_std::default_delete<helics::FedObject>_> *)
             (this->feds).m_obj.
             super__Deque_base<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppuVar6 = (this->feds).m_obj.
              super__Deque_base<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    local_60 = false;
    do {
      pFVar2 = (this_01->_M_t).
               super__Tuple_impl<0UL,_helics::FedObject_*,_std::default_delete<helics::FedObject>_>.
               super__Head_base<0UL,_helics::FedObject_*,_false>._M_head_impl;
      if ((((pFVar2 != (FedObject *)0x0) &&
           (peVar3 = (pFVar2->fedptr).
                     super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
           peVar3 != (element_type *)0x0)) && ((peVar3->mName)._M_string_length == __n)) &&
         (((__n == 0 ||
           (iVar4 = bcmp(fedName._M_str,(peVar3->mName)._M_dataplus._M_p,__n), iVar4 == 0)) &&
          (pFVar2->valid == validationCode)))) {
        pFVar2->valid = 0;
        this_00 = (pFVar2->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        (pFVar2->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (pFVar2->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        std::__uniq_ptr_impl<helics::FedObject,_std::default_delete<helics::FedObject>_>::reset
                  (this_01,(pointer)0x0);
        local_60 = true;
      }
      this_01 = this_01 + 1;
      if (this_01 == p_Var5) {
        this_01 = (__uniq_ptr_impl<helics::FedObject,_std::default_delete<helics::FedObject>_> *)
                  ppuVar6[1];
        ppuVar6 = ppuVar6 + 1;
        p_Var5 = this_01 + 0x40;
      }
    } while (this_01 != p_Var1);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return local_60;
}

Assistant:

bool MasterObjectHolder::removeFed(std::string_view fedName, int validationCode)
{
    auto handle = feds.lock();
    bool found{false};
    for (auto& fed : (*handle)) {
        if ((fed) && (fed->fedptr)) {
            if (fed->fedptr->getName() == fedName && fed->valid == validationCode) {
                fed->valid = 0;
                fed->fedptr.reset();
                fed.reset();
                found = true;
            }
        }
    }
    return found;
}